

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.cc
# Opt level: O1

void CRYPTO_chacha_20(uint8_t *out,uint8_t *in,size_t in_len,uint8_t *key,uint8_t *nonce,
                     uint32_t counter)

{
  uint32_t uVar1;
  ulong uVar2;
  byte bVar3;
  bool bVar4;
  uint32_t counter_nonce [4];
  uint local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  
  if (((in != out) && (in < out + in_len)) && (out < in + in_len)) {
    __assert_fail("!buffers_alias(out, in_len, in, in_len) || in == out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/chacha/chacha.cc"
                  ,0x65,
                  "void CRYPTO_chacha_20(uint8_t *, const uint8_t *, size_t, const uint8_t *, const uint8_t *, uint32_t)"
                 );
  }
  local_44 = *(undefined4 *)nonce;
  local_40 = *(undefined4 *)(nonce + 4);
  local_3c = *(undefined4 *)(nonce + 8);
  local_48 = counter;
  if (in_len != 0) {
    do {
      uVar2 = (ulong)local_48 * -0x40 + 0x4000000000;
      if (in_len <= uVar2) {
        uVar2 = in_len;
      }
      if (uVar2 < 0x81) {
        bVar3 = 0;
LAB_001765de:
        bVar4 = true;
        if (uVar2 < 0xc1) {
          uVar1 = OPENSSL_get_ia32cap(1);
          bVar4 = (uVar1 & 0x4400000) != 0x400000;
        }
        if ((bVar3 & bVar4) == 1) {
          ChaCha20_ctr32_ssse3_4x(out,in,uVar2,key,&local_48);
        }
        else {
          if (0x80 < uVar2) {
            uVar1 = OPENSSL_get_ia32cap(1);
            if ((uVar1 >> 9 & 1) != 0) {
              ChaCha20_ctr32_ssse3(out,in,uVar2,key,&local_48);
              goto LAB_00176678;
            }
          }
          ChaCha20_ctr32_nohw(out,in,uVar2,key,&local_48);
        }
      }
      else {
        uVar1 = OPENSSL_get_ia32cap(2);
        if ((uVar1 & 0x20) == 0) {
          uVar1 = OPENSSL_get_ia32cap(1);
          bVar3 = (byte)(uVar1 >> 9) & 1;
          goto LAB_001765de;
        }
        ChaCha20_ctr32_avx2(out,in,uVar2,key,&local_48);
      }
LAB_00176678:
      in = in + uVar2;
      out = out + uVar2;
      local_48 = 0;
      in_len = in_len - uVar2;
    } while (in_len != 0);
  }
  return;
}

Assistant:

void CRYPTO_chacha_20(uint8_t *out, const uint8_t *in, size_t in_len,
                      const uint8_t key[32], const uint8_t nonce[12],
                      uint32_t counter) {
  assert(!buffers_alias(out, in_len, in, in_len) || in == out);

  uint32_t counter_nonce[4];
  counter_nonce[0] = counter;
  counter_nonce[1] = CRYPTO_load_u32_le(nonce + 0);
  counter_nonce[2] = CRYPTO_load_u32_le(nonce + 4);
  counter_nonce[3] = CRYPTO_load_u32_le(nonce + 8);

  const uint32_t *key_ptr = (const uint32_t *)key;
#if !defined(OPENSSL_X86) && !defined(OPENSSL_X86_64)
  // The assembly expects the key to be four-byte aligned.
  uint32_t key_u32[8];
  if ((((uintptr_t)key) & 3) != 0) {
    key_u32[0] = CRYPTO_load_u32_le(key + 0);
    key_u32[1] = CRYPTO_load_u32_le(key + 4);
    key_u32[2] = CRYPTO_load_u32_le(key + 8);
    key_u32[3] = CRYPTO_load_u32_le(key + 12);
    key_u32[4] = CRYPTO_load_u32_le(key + 16);
    key_u32[5] = CRYPTO_load_u32_le(key + 20);
    key_u32[6] = CRYPTO_load_u32_le(key + 24);
    key_u32[7] = CRYPTO_load_u32_le(key + 28);

    key_ptr = key_u32;
  }
#endif

  while (in_len > 0) {
    // The assembly functions do not have defined overflow behavior. While
    // overflow is almost always a bug in the caller, we prefer our functions to
    // behave the same across platforms, so divide into multiple calls to avoid
    // this case.
    uint64_t todo = 64 * ((UINT64_C(1) << 32) - counter_nonce[0]);
    if (todo > in_len) {
      todo = in_len;
    }

    ChaCha20_ctr32(out, in, (size_t)todo, key_ptr, counter_nonce);
    in += todo;
    out += todo;
    in_len -= todo;

    // We're either done and will next break out of the loop, or we stopped at
    // the wraparound point and the counter should continue at zero.
    counter_nonce[0] = 0;
  }
}